

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlAttributePtr attr)

{
  long lVar1;
  long lVar2;
  int iVar3;
  xmlEnumerationPtr local_68;
  xmlEnumerationPtr tree;
  int extId;
  xmlAttributeTablePtr table;
  xmlChar *pxStack_48;
  int nbId;
  xmlChar *elemPrefix;
  xmlChar *elemLocalName;
  xmlElementPtr elem;
  int val;
  int ret;
  xmlAttributePtr attr_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  elem._4_4_ = 1;
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if (attr == (xmlAttributePtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else {
    _val = attr;
    attr_local = (xmlAttributePtr)doc;
    doc_local = (xmlDocPtr)ctxt;
    if (attr->defaultValue != (xmlChar *)0x0) {
      elem._0_4_ = xmlValidateAttributeValueInternal(doc,attr->atype,attr->defaultValue);
      if ((uint)elem == 0) {
        xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ATTRIBUTE_DEFAULT,
                        "Syntax of default value for attribute %s of %s is not valid\n",_val->name,
                        _val->elem,(xmlChar *)0x0);
      }
      elem._4_4_ = (uint)elem & elem._4_4_;
    }
    if (((_val->atype == XML_ATTRIBUTE_ID) && (_val->def != XML_ATTRIBUTE_IMPLIED)) &&
       (_val->def != XML_ATTRIBUTE_REQUIRED)) {
      xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ID_FIXED,
                      "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",
                      _val->name,_val->elem,(xmlChar *)0x0);
      elem._4_4_ = 0;
    }
    if (_val->atype == XML_ATTRIBUTE_ID) {
      elemLocalName = (xmlChar *)0x0;
      elemPrefix = xmlSplitQName4(_val->elem,&stack0xffffffffffffffb8);
      if (elemPrefix == (xmlChar *)0x0) {
        xmlVErrMemory((xmlValidCtxtPtr)doc_local);
        return 0;
      }
      lVar1._0_4_ = attr_local->atype;
      lVar1._4_4_ = attr_local->def;
      if (lVar1 != 0) {
        elemLocalName =
             (xmlChar *)
             xmlHashLookup2(*(xmlHashTablePtr *)(*(long *)&attr_local->atype + 0x50),elemPrefix,
                            pxStack_48);
      }
      if (elemLocalName == (xmlChar *)0x0) {
        table._4_4_ = 0;
        lVar2._0_4_ = attr_local->atype;
        lVar2._4_4_ = attr_local->def;
        if (lVar2 != 0) {
          xmlHashScan3(*(xmlHashTablePtr *)(*(long *)&attr_local->atype + 0x58),(xmlChar *)0x0,
                       (xmlChar *)0x0,_val->elem,xmlValidateAttributeIdCallback,
                       (void *)((long)&table + 4));
        }
      }
      else {
        table._4_4_ = xmlScanIDAttributeDecl
                                ((xmlValidCtxtPtr)doc_local,(xmlElementPtr)elemLocalName,0);
      }
      if (table._4_4_ < 2) {
        if (attr_local->defaultValue != (xmlChar *)0x0) {
          tree._4_4_ = 0;
          elemLocalName =
               (xmlChar *)
               xmlHashLookup2(*(xmlHashTablePtr *)(attr_local->defaultValue + 0x50),elemPrefix,
                              pxStack_48);
          if ((xmlElementPtr)elemLocalName != (xmlElementPtr)0x0) {
            tree._4_4_ = xmlScanIDAttributeDecl
                                   ((xmlValidCtxtPtr)doc_local,(xmlElementPtr)elemLocalName,0);
          }
          if (tree._4_4_ < 2) {
            if (1 < tree._4_4_ + table._4_4_) {
              xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ID_SUBSET,
                              "Element %s has ID attributes defined in the internal and external subset : %s\n"
                              ,_val->elem,_val->name,(xmlChar *)0x0);
              elem._4_4_ = 0;
            }
          }
          else {
            xmlErrValidNodeNr((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ID_SUBSET,
                              "Element %s has %d ID attribute defined in the external subset : %s\n"
                              ,_val->elem,tree._4_4_,_val->name);
            elem._4_4_ = 0;
          }
        }
      }
      else {
        xmlErrValidNodeNr((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ID_SUBSET,
                          "Element %s has %d ID attribute defined in the internal subset : %s\n",
                          _val->elem,table._4_4_,_val->name);
        elem._4_4_ = 0;
      }
      (*xmlFree)(pxStack_48);
    }
    if ((_val->defaultValue != (xmlChar *)0x0) && (_val->tree != (xmlEnumerationPtr)0x0)) {
      local_68 = _val->tree;
      while ((local_68 != (xmlEnumerationPtr)0x0 &&
             (iVar3 = xmlStrEqual(local_68->name,_val->defaultValue), iVar3 == 0))) {
        local_68 = local_68->next;
      }
      if (local_68 == (xmlEnumerationPtr)0x0) {
        xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)_val,XML_DTD_ATTRIBUTE_VALUE,
                        "Default value \"%s\" for attribute %s of %s is not among the enumerated set\n"
                        ,_val->defaultValue,_val->name,_val->elem);
        elem._4_4_ = 0;
      }
    }
    ctxt_local._4_4_ = elem._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                         xmlAttributePtr attr) {
    int ret = 1;
    int val;
    CHECK_DTD;
    if(attr == NULL) return(1);

    /* Attribute Default Legal */
    /* Enumeration */
    if (attr->defaultValue != NULL) {
	val = xmlValidateAttributeValueInternal(doc, attr->atype,
	                                        attr->defaultValue);
	if (val == 0) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_DEFAULT,
	       "Syntax of default value for attribute %s of %s is not valid\n",
	           attr->name, attr->elem, NULL);
	}
        ret &= val;
    }

    /* ID Attribute Default */
    if ((attr->atype == XML_ATTRIBUTE_ID)&&
        (attr->def != XML_ATTRIBUTE_IMPLIED) &&
	(attr->def != XML_ATTRIBUTE_REQUIRED)) {
	xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_FIXED,
          "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",
	       attr->name, attr->elem, NULL);
	ret = 0;
    }

    /* One ID per Element Type */
    if (attr->atype == XML_ATTRIBUTE_ID) {
        xmlElementPtr elem = NULL;
        const xmlChar *elemLocalName;
        xmlChar *elemPrefix;
        int nbId;

        elemLocalName = xmlSplitQName4(attr->elem, &elemPrefix);
        if (elemLocalName == NULL) {
            xmlVErrMemory(ctxt);
            return(0);
        }

	/* the trick is that we parse DtD as their own internal subset */
        if (doc->intSubset != NULL)
            elem = xmlHashLookup2(doc->intSubset->elements,
                                  elemLocalName, elemPrefix);
	if (elem != NULL) {
	    nbId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	} else {
	    xmlAttributeTablePtr table;

	    /*
	     * The attribute may be declared in the internal subset and the
	     * element in the external subset.
	     */
	    nbId = 0;
	    if (doc->intSubset != NULL) {
		table = (xmlAttributeTablePtr) doc->intSubset->attributes;
		xmlHashScan3(table, NULL, NULL, attr->elem,
			     xmlValidateAttributeIdCallback, &nbId);
	    }
	}
	if (nbId > 1) {

	    xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the internal subset : %s\n",
		   attr->elem, nbId, attr->name);
            ret = 0;
	} else if (doc->extSubset != NULL) {
	    int extId = 0;
	    elem = xmlHashLookup2(doc->extSubset->elements,
                                  elemLocalName, elemPrefix);
	    if (elem != NULL) {
		extId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	    }
	    if (extId > 1) {
		xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the external subset : %s\n",
		       attr->elem, extId, attr->name);
                ret = 0;
	    } else if (extId + nbId > 1) {
		xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
"Element %s has ID attributes defined in the internal and external subset : %s\n",
		       attr->elem, attr->name, NULL);
                ret = 0;
	    }
	}

        xmlFree(elemPrefix);
    }

    /* Validity Constraint: Enumeration */
    if ((attr->defaultValue != NULL) && (attr->tree != NULL)) {
        xmlEnumerationPtr tree = attr->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, attr->defaultValue)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_VALUE,
"Default value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   attr->defaultValue, attr->name, attr->elem);
	    ret = 0;
	}
    }

    return(ret);
}